

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_test_duplicate_non_refresh_registrations_do_not_add_controls_Test::TestBody
          (SubjectSetRegisterTest_test_duplicate_non_refresh_registrations_do_not_add_controls_Test
           *this)

{
  long lVar1;
  char *in_R9;
  AssertHelper AStack_1c8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c0;
  string local_1b8;
  AssertionResult gtest_ar_;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_170;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  SubjectSetRegister subject_register;
  optional<bidfx_public_api::price::pixie::SubscriptionSync> message;
  
  bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetRegister(&subject_register);
  bidfx_public_api::price::subject::Subject::Subject((Subject *)&local_128,(Subject *)SS_SUBJECT0);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(&subject_register,&local_128,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_128);
  bidfx_public_api::price::subject::Subject::Subject((Subject *)&local_140,(Subject *)SS_SUBJECT0);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(&subject_register,&local_140,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_140);
  bidfx_public_api::price::subject::Subject::Subject((Subject *)&local_158,(Subject *)SS_SUBJECT1);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(&subject_register,&local_158,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_158);
  bidfx_public_api::price::subject::Subject::Subject((Subject *)&local_170,(Subject *)SS_SUBJECT1);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(&subject_register,&local_170,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_170);
  bidfx_public_api::price::subject::Subject::Subject((Subject *)&local_188,(Subject *)SS_SUBJECT1);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(&subject_register,&local_188,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_188);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  gtest_ar_.success_ =
       message.super__Optional_base<bidfx_public_api::price::pixie::SubscriptionSync,_false,_false>.
       _M_payload.
       super__Optional_payload<bidfx_public_api::price::pixie::SubscriptionSync,_true,_false,_false>
       .super__Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>._M_engaged;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (message.super__Optional_base<bidfx_public_api::price::pixie::SubscriptionSync,_false,_false>.
      _M_payload.
      super__Optional_payload<bidfx_public_api::price::pixie::SubscriptionSync,_true,_false,_false>.
      super__Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>._M_engaged ==
      false) {
    testing::Message::Message((Message *)&local_1c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1b8,(internal *)&gtest_ar_,(AssertionResult *)0x1f6f66,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_1c8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x1f9,local_1b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_1c8,(Message *)&local_1c0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    lVar1 = bidfx_public_api::price::pixie::SubscriptionSync::GetControls();
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    gtest_ar_.success_ = *(long *)(lVar1 + 0x28) == 0;
    if (gtest_ar_.success_) goto LAB_001a5035;
    testing::Message::Message((Message *)&local_1c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1b8,(internal *)&gtest_ar_,(AssertionResult *)"message->GetControls().empty()"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x1fa,local_1b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_1c8,(Message *)&local_1c0);
  }
  testing::internal::AssertHelper::~AssertHelper(&AStack_1c8);
  std::__cxx11::string::~string((string *)&local_1b8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_1c0);
LAB_001a5035:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_reset
            ((_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> *)&message);
  SubjectSetRegister::~SubjectSetRegister(&subject_register);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, test_duplicate_non_refresh_registrations_do_not_add_controls)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    subject_register.Register(SS_SUBJECT0, false);
    subject_register.Register(SS_SUBJECT0, false);

    subject_register.Register(SS_SUBJECT1, false);
    subject_register.Register(SS_SUBJECT1, false);
    subject_register.Register(SS_SUBJECT1, false);

    std::optional<SubscriptionSync> message = subject_register.NextSubscriptionSync();
    ASSERT_TRUE(message);
    EXPECT_TRUE(message->GetControls().empty());
}